

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrDestroySenseDataSnapshotBD(XrSenseDataSnapshotBD snapshot)

{
  ValidateXrHandleResult VVar1;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_sensedatasnapshotbd_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_270 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_250;
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [32];
  XrSenseDataSnapshotBD_T local_1e8 [32];
  ostringstream local_1c8 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_3c;
  undefined1 local_38 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrSenseDataSnapshotBD pXStack_18;
  XrResult xr_result;
  XrSenseDataSnapshotBD snapshot_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  pXStack_18 = snapshot;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_38);
  local_3c = XR_OBJECT_TYPE_SENSE_DATA_SNAPSHOT_BD;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSenseDataSnapshotBD_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_38
             ,&stack0xffffffffffffffe8,&local_3c);
  VVar1 = VerifyXrSenseDataSnapshotBDHandle(&stack0xffffffffffffffe8);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    HandleInfo<XrSenseDataSnapshotBD_T_*>::getWithInstanceInfo
              (&g_sensedatasnapshotbd_info,pXStack_18);
    snapshot_local._4_4_ =
         objects_info.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1c8);
    std::operator<<((ostream *)local_1c8,"Invalid XrSenseDataSnapshotBD handle \"snapshot\" ");
    HandleToHexString<XrSenseDataSnapshotBD_T*>(local_1e8);
    std::operator<<((ostream *)local_1c8,(string *)local_1e8);
    std::__cxx11::string::~string((string *)local_1e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_208,"VUID-xrDestroySenseDataSnapshotBD-snapshot-parameter",&local_209);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_230,"xrDestroySenseDataSnapshotBD",&local_231);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_250,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_38);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_208,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_230,&local_250,local_270);
    std::__cxx11::string::~string((string *)local_270);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_250);
    std::__cxx11::string::~string(local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    std::__cxx11::string::~string(local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    snapshot_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    std::__cxx11::ostringstream::~ostringstream(local_1c8);
  }
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_38);
  return snapshot_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrDestroySenseDataSnapshotBD(
XrSenseDataSnapshotBD snapshot) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(snapshot, XR_OBJECT_TYPE_SENSE_DATA_SNAPSHOT_BD);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSenseDataSnapshotBDHandle(&snapshot);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSenseDataSnapshotBD handle \"snapshot\" ";
                oss << HandleToHexString(snapshot);
                CoreValidLogMessage(nullptr, "VUID-xrDestroySenseDataSnapshotBD-snapshot-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrDestroySenseDataSnapshotBD",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_sensedatasnapshotbd_info.getWithInstanceInfo(snapshot);
        GenValidUsageXrHandleInfo *gen_sensedatasnapshotbd_info = info_with_instance.first;
        (void)gen_sensedatasnapshotbd_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}